

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

void __thiscall
CVmObjByteArray::restore_from_file
          (CVmObjByteArray *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *param_3)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong buflen;
  long lVar4;
  ulong ele_count;
  char b [4];
  uint local_2c;
  
  CVmFile::read_bytes(fp,(char *)&local_2c,4);
  ele_count = (ulong)local_2c;
  puVar1 = (uint *)(this->super_CVmObject).ext_;
  if (puVar1 != (uint *)0x0) {
    if (*puVar1 == local_2c) goto LAB_00274e65;
    (*(this->super_CVmObject)._vptr_CVmObject[2])(this,0);
  }
  alloc_array(this,ele_count);
LAB_00274e65:
  if (ele_count != 0) {
    lVar4 = 1;
    do {
      uVar2 = (uint)(lVar4 - 1U);
      uVar3 = (ulong)(uVar2 & 0x7fff);
      buflen = 0x8000 - uVar3;
      if (ele_count <= buflen) {
        buflen = ele_count;
      }
      CVmFile::read_bytes(fp,(char *)(uVar3 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                                 (lVar4 - 1U >> 0x1c) * 8 + 4) +
                                                       (ulong)(uVar2 >> 0xc & 0xfff8))),buflen);
      lVar4 = lVar4 + buflen;
      ele_count = ele_count - buflen;
    } while (ele_count != 0);
  }
  return;
}

Assistant:

void CVmObjByteArray::restore_from_file(VMG_ vm_obj_id_t self,
                                        CVmFile *fp, CVmObjFixup *)
{
    unsigned long ele_cnt;
    unsigned long idx;
    unsigned long rem;

    /* read the element count */
    ele_cnt = fp->read_uint4();

    /* allocate or reallocate as needed */
    if (ext_ == 0)
    {
        /* we're not yet allocated - allocate now */
        alloc_array(vmg_ ele_cnt);
    }
    else
    {
        /* already allocated - if it's a different size, reallocate */
        if (get_element_count() != ele_cnt)
        {
            /* delete the old array */
            notify_delete(vmg_ FALSE);

            /* allocate a new one */
            alloc_array(vmg_ ele_cnt);
        }
    }

    /* read the data */
    for (idx = 1, rem = ele_cnt ; rem != 0 ; )
    {
        size_t avail;
        size_t chunk;
        unsigned char *p;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit this copy to the remaining bytes */
        chunk = avail;
        if (chunk > rem)
            chunk = (size_t)rem;

        /* read this chunk */
        fp->read_bytes((char *)p, chunk);

        /* advance past this chunk */
        idx += chunk;
        rem -= chunk;
    }
}